

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

bool __thiscall VulkanHppGenerator::isHandleTypeByStructure(VulkanHppGenerator *this,string *type)

{
  bool bVar1;
  const_iterator cVar2;
  VulkanHppGenerator *this_00;
  allocator<char> local_39;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
          ::find(&(this->m_structs)._M_t,type);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->m_structs)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = false;
  }
  else {
    this_00 = (VulkanHppGenerator *)&stack0xffffffffffffffc8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffc8,"",&local_39);
    bVar1 = describesVector(this_00,(StructureData *)(cVar2._M_node + 2),
                            (string *)&stack0xffffffffffffffc8);
    if (bVar1) {
      bVar1 = isHandleType(this,(string *)&cVar2._M_node[3]._M_right[0x28]._M_parent);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  return bVar1;
}

Assistant:

bool VulkanHppGenerator::isHandleTypeByStructure( std::string const & type ) const
{
  auto structIt = m_structs.find( type );
  return ( structIt != m_structs.end() ) && describesVector( structIt->second ) && isHandleType( structIt->second.members[3].type.type );
}